

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

RefPtr<wabt::interp::Table> * __thiscall
wabt::interp::Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
          (RefPtr<wabt::interp::Table> *__return_storage_ptr__,Store *this,Store *args,
          TableType *args_1)

{
  Table *this_00;
  Ref ref;
  Store *pSVar1;
  Table *local_60;
  TableType local_58;
  
  pSVar1 = this;
  this_00 = (Table *)operator_new(0x88);
  local_58.super_ExternType.kind = (args_1->super_ExternType).kind;
  local_58.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00186100;
  local_58._12_8_ = *(undefined8 *)&(args_1->super_ExternType).field_0xc;
  local_58.limits._11_8_ = *(undefined8 *)((long)&(args_1->limits).max + 3);
  local_58.limits._4_7_ = SUB87((ulong)*(undefined8 *)((long)&(args_1->limits).initial + 3) >> 8,0);
  local_58._20_7_ = SUB87(*(undefined8 *)&args_1->field_0x14,0);
  local_58.limits.initial._3_1_ = (undefined1)((ulong)*(undefined8 *)&args_1->field_0x14 >> 0x38);
  Table::Table(this_00,pSVar1,&local_58);
  local_60 = this_00;
  ref.index = FreeList<wabt::interp::Object*>::New<wabt::interp::Table*>
                        ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_60);
  RefPtr<wabt::interp::Table>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Extern).super_Object.self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}